

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcap.c
# Opt level: O0

void substcap(luaL_Buffer *b,CapState *cs)

{
  char *pcVar1;
  int iVar2;
  char *next;
  char *curr;
  CapState *cs_local;
  luaL_Buffer *b_local;
  
  next = cs->cap->s;
  if (cs->cap->siz == '\0') {
    cs->cap = cs->cap + 1;
    while (cs->cap->kind != '\0') {
      pcVar1 = cs->cap->s;
      luaL_addlstring(b,next,(long)pcVar1 - (long)next);
      iVar2 = addonestring(b,cs,"replacement");
      next = pcVar1;
      if (iVar2 != 0) {
        next = cs->cap[-1].s + (long)(int)(uint)cs->cap[-1].siz + -1;
      }
    }
    luaL_addlstring(b,next,(long)cs->cap->s - (long)next);
  }
  else {
    luaL_addlstring(b,next,(long)(int)(cs->cap->siz - 1));
  }
  cs->cap = cs->cap + 1;
  return;
}

Assistant:

static void substcap (luaL_Buffer *b, CapState *cs) {
  const char *curr = cs->cap->s;
  if (isfullcap(cs->cap))  /* no nested captures? */
    luaL_addlstring(b, curr, cs->cap->siz - 1);  /* keep original text */
  else {
    cs->cap++;  /* skip open entry */
    while (!isclosecap(cs->cap)) {  /* traverse nested captures */
      const char *next = cs->cap->s;
      luaL_addlstring(b, curr, next - curr);  /* add text up to capture */
      if (addonestring(b, cs, "replacement"))
        curr = closeaddr(cs->cap - 1);  /* continue after match */
      else  /* no capture value */
        curr = next;  /* keep original text in final result */
    }
    luaL_addlstring(b, curr, cs->cap->s - curr);  /* add last piece of text */
  }
  cs->cap++;  /* go to next capture */
}